

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

value_type * __thiscall QList<Symbol>::takeLast(QList<Symbol> *this)

{
  QArrayDataPointer<Symbol> *in_RSI;
  Symbol *in_RDI;
  value_type *v;
  Symbol *in_stack_ffffffffffffffc8;
  
  memset(in_RDI,0xaa,0x30);
  last((QList<Symbol> *)in_stack_ffffffffffffffc8);
  Symbol::Symbol(in_RDI,in_stack_ffffffffffffffc8);
  QArrayDataPointer<Symbol>::operator->(in_RSI);
  QtPrivate::QGenericArrayOps<Symbol>::eraseLast((QGenericArrayOps<Symbol> *)in_RDI);
  return in_RDI;
}

Assistant:

value_type takeLast() { Q_ASSERT(!isEmpty()); value_type v = std::move(last()); d->eraseLast(); return v; }